

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalNinjaGenerator::AdditionalCleanFiles(cmLocalNinjaGenerator *this,string *config)

{
  cmMakefile *this_00;
  cmGlobalNinjaGenerator *this_01;
  pointer pbVar1;
  cmValue cVar2;
  string *in_base;
  pointer in_path;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"ADDITIONAL_CLEAN_FILES",(allocator<char> *)&local_90);
  cVar2 = cmMakefile::GetProperty(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if (cVar2.Value != (string *)0x0) {
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_70,(string *)cVar2.Value);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&local_b0,&local_70,(cmLocalGenerator *)this,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_90);
    arg._M_str = local_b0._M_dataplus._M_p;
    arg._M_len = local_b0._M_string_length;
    cmExpandList(arg,&local_c8,false);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    pbVar1 = local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_01 = (cmGlobalNinjaGenerator *)
              (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
    for (in_path = local_c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; in_path != pbVar1;
        in_path = in_path + 1) {
      cmsys::SystemTools::CollapseFullPath(&local_50,in_path,in_base);
      cmGlobalNinjaGenerator::AddAdditionalCleanFile(this_01,&local_50,config);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::AdditionalCleanFiles(const std::string& config)
{
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    std::vector<std::string> cleanFiles;
    {
      cmExpandList(cmGeneratorExpression::Evaluate(*prop_value, this, config),
                   cleanFiles);
    }
    std::string const& binaryDir = this->GetCurrentBinaryDirectory();
    cmGlobalNinjaGenerator* gg = this->GetGlobalNinjaGenerator();
    for (std::string const& cleanFile : cleanFiles) {
      // Support relative paths
      gg->AddAdditionalCleanFile(
        cmSystemTools::CollapseFullPath(cleanFile, binaryDir), config);
    }
  }
}